

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O2

ngx_int_t ngx_http_fastcgi_process_header(ngx_http_request_t *r)

{
  size_t *psVar1;
  ngx_buf_t *b;
  ngx_http_fastcgi_ctx_t *f;
  ngx_hash_t *hash;
  ngx_http_upstream_t *pnVar2;
  byte *s1;
  byte *pbVar3;
  ngx_http_cache_t *pnVar4;
  ngx_log_t *pnVar5;
  char *s2;
  size_t sVar6;
  ngx_table_elt_t *pnVar7;
  ngx_http_upstream_state_t *pnVar8;
  bool bVar9;
  byte bVar10;
  ngx_http_fastcgi_state_e nVar11;
  ngx_int_t nVar12;
  u_char *puVar13;
  byte *pbVar14;
  u_char *puVar15;
  u_char *puVar16;
  ngx_uint_t *pnVar17;
  ngx_uint_t nVar18;
  void *pvVar19;
  long lVar20;
  ngx_array_t *pnVar21;
  u_char *__src;
  long *plVar22;
  ngx_uint_t nVar23;
  byte *pbVar24;
  u_char *puVar25;
  size_t sVar26;
  long *plVar28;
  ulong uVar29;
  undefined8 *puVar30;
  bool bVar31;
  undefined1 local_d8 [8];
  ngx_buf_t buf;
  u_char *local_48;
  byte *pbVar27;
  
  f = (ngx_http_fastcgi_ctx_t *)r->ctx[ngx_http_fastcgi_module.ctx_index];
  hash = (ngx_hash_t *)r->main_conf[ngx_http_upstream_module.ctx_index];
  pnVar2 = r->upstream;
  b = &pnVar2->buffer;
  buf._72_8_ = &pnVar2->headers_in;
  do {
    while( true ) {
      nVar11 = f->state;
      if (ngx_http_fastcgi_st_reserved < nVar11) goto LAB_0016e6fc;
      puVar15 = (pnVar2->buffer).pos;
      puVar13 = (pnVar2->buffer).last;
      while( true ) {
        f->pos = puVar15;
        f->last = puVar13;
        nVar12 = ngx_http_fastcgi_process_record(r,f);
        (pnVar2->buffer).pos = f->pos;
        (pnVar2->buffer).last = f->last;
        if (nVar12 == -2) {
          return -2;
        }
        if (nVar12 == -1) {
          return 0x28;
        }
        if ((f->type & 0xfffffffffffffffe) != 6) {
          pnVar5 = r->connection->log;
          if (3 < pnVar5->log_level) {
            ngx_log_error_core(4,pnVar5,0,"upstream sent unexpected FastCGI record: %ui");
            return 0x28;
          }
          return 0x28;
        }
        if ((f->type == 6) && (f->length == 0)) {
          pnVar5 = r->connection->log;
          if (3 < pnVar5->log_level) {
            ngx_log_error_core(4,pnVar5,0,"upstream prematurely closed FastCGI stdout");
            return 0x28;
          }
          return 0x28;
        }
        nVar11 = f->state;
LAB_0016e6fc:
        if (nVar11 != ngx_http_fastcgi_st_padding) break;
        puVar25 = (pnVar2->buffer).pos;
        puVar13 = (pnVar2->buffer).last;
        puVar15 = puVar25 + f->padding;
        if (puVar13 <= puVar15) {
          if (puVar15 == puVar13) {
            f->state = ngx_http_fastcgi_st_version;
          }
          else {
            f->padding = (size_t)(puVar25 + (f->padding - (long)puVar13));
          }
          b->pos = puVar13;
          return -2;
        }
        f->state = ngx_http_fastcgi_st_version;
        b->pos = puVar15;
      }
      if (f->type != 7) break;
      sVar26 = f->length;
      if (sVar26 == 0) {
        f->state = ngx_http_fastcgi_st_padding;
      }
      else {
        s1 = (pnVar2->buffer).pos;
        pbVar3 = (pnVar2->buffer).last;
        pbVar27 = s1 + sVar26;
        if (pbVar3 < pbVar27) {
          pbVar24 = s1 + (sVar26 - (long)pbVar3);
          pbVar14 = pbVar3;
        }
        else {
          f->state = ngx_http_fastcgi_st_padding;
          pbVar24 = (byte *)0x0;
          pbVar14 = pbVar27;
        }
        f->length = (size_t)pbVar24;
        b->pos = pbVar14;
        if (pbVar3 < pbVar27) {
          pbVar27 = pbVar3;
        }
        sVar26 = (long)pbVar27 - (long)s1;
        while (((pbVar14 = pbVar14 + -1, s1 < pbVar14 && ((ulong)*pbVar14 < 0x2f)) &&
               ((0x400100002400U >> ((ulong)*pbVar14 & 0x3f) & 1) != 0))) {
          sVar26 = sVar26 - 1;
        }
        pnVar5 = r->connection->log;
        if (3 < pnVar5->log_level) {
          ngx_log_error_core(4,pnVar5,0,"FastCGI sent in stderr: \"%*s\"",sVar26,s1);
        }
        pvVar19 = r->loc_conf[ngx_http_fastcgi_module.ctx_index];
        plVar22 = *(long **)((long)pvVar19 + 0x230);
        if (plVar22 != (long *)0x0) {
          puVar30 = (undefined8 *)(*plVar22 + 8);
          uVar29 = 0xffffffffffffffff;
          while (uVar29 = uVar29 + 1, uVar29 < *(ulong *)(*(long *)((long)pvVar19 + 0x230) + 8)) {
            s2 = (char *)*puVar30;
            puVar30 = puVar30 + 2;
            puVar15 = ngx_strnstr(s1,s2,sVar26);
            if (puVar15 != (u_char *)0x0) {
              return 0x28;
            }
          }
        }
        if ((pnVar2->buffer).pos == (pnVar2->buffer).last) {
          if ((f->field_0x40 & 1) != 0) {
            return -2;
          }
          puVar15 = (pnVar2->buffer).start;
          if (r->cache != (ngx_http_cache_t *)0x0) {
            puVar15 = puVar15 + r->cache->header_start;
          }
          (pnVar2->buffer).pos = puVar15;
          (pnVar2->buffer).last = puVar15;
          f->field_0x40 = f->field_0x40 | 2;
          return -2;
        }
      }
    }
    bVar10 = f->field_0x40;
    if (((bVar10 & 2) != 0) && (pnVar4 = r->cache, pnVar4 != (ngx_http_cache_t *)0x0)) {
      puVar13 = (pnVar2->buffer).start + pnVar4->header_start;
      puVar15 = (pnVar2->buffer).pos;
      puVar25 = puVar15 + (-0x10 - (long)puVar13);
      if ((long)puVar25 < 0) {
        pnVar4->header_start = (size_t)(puVar15 + (pnVar4->header_start - (long)puVar13) + -8);
      }
      else {
        puVar13[0] = '\x01';
        puVar13[1] = '\a';
        puVar13[2] = '\0';
        puVar13[3] = '\x01';
        puVar13[4] = (u_char)((ulong)puVar25 >> 8);
        puVar13[5] = (u_char)puVar25;
        puVar13[6] = '\0';
        puVar13[7] = '\0';
      }
      bVar10 = f->field_0x40 & 0xfd;
    }
    f->field_0x40 = bVar10 | 1;
    puVar15 = (pnVar2->buffer).pos;
    puVar13 = (pnVar2->buffer).last;
    puVar16 = puVar15 + f->length;
    puVar25 = puVar15;
    if (puVar16 < puVar13) {
      (pnVar2->buffer).last = puVar16;
      local_48 = puVar13;
    }
    else {
      local_48 = (u_char *)0x0;
      puVar16 = puVar13;
    }
    do {
      __src = puVar25;
      puVar13 = puVar16;
      nVar12 = ngx_http_parse_header_line(r,b,1);
      pnVar5 = r->connection->log;
      if ((pnVar5->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar5,0,"http fastcgi parser: %i",nVar12);
      }
      if (nVar12 != 0) {
        if (nVar12 == -2) {
          bVar31 = false;
          goto LAB_0016ec84;
        }
        if (nVar12 != 1) {
          pnVar5 = r->connection->log;
          if (3 < pnVar5->log_level) {
            ngx_log_error_core(4,pnVar5,0,"upstream sent invalid header");
            return 0x28;
          }
          return 0x28;
        }
        pnVar5 = r->connection->log;
        if ((pnVar5->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar5,0,"http fastcgi header done");
        }
        pnVar7 = (pnVar2->headers_in).status;
        if (pnVar7 == (ngx_table_elt_t *)0x0) {
          if ((pnVar2->headers_in).location == (ngx_table_elt_t *)0x0) {
            (pnVar2->headers_in).status_n = 200;
            (pnVar2->headers_in).status_line.len = 6;
            (pnVar2->headers_in).status_line.data = (u_char *)"200 OK";
            nVar18 = 200;
          }
          else {
            (pnVar2->headers_in).status_n = 0x12e;
            (pnVar2->headers_in).status_line.len = 0x15;
            (pnVar2->headers_in).status_line.data = (u_char *)"302 Moved Temporarily";
            nVar18 = 0x12e;
          }
        }
        else {
          nVar18 = ngx_atoi((pnVar7->value).data,3);
          if (nVar18 == 0xffffffffffffffff) {
            pnVar5 = r->connection->log;
            if (pnVar5->log_level < 4) {
              return 0x28;
            }
            ngx_log_error_core(4,pnVar5,0,"upstream sent invalid status \"%V\"",&pnVar7->value);
            return 0x28;
          }
          (pnVar2->headers_in).status_n = nVar18;
          puVar25 = (pnVar7->value).data;
          (pnVar2->headers_in).status_line.len = (pnVar7->value).len;
          (pnVar2->headers_in).status_line.data = puVar25;
        }
        pnVar8 = pnVar2->state;
        bVar9 = true;
        if ((pnVar8 != (ngx_http_upstream_state_t *)0x0) && (pnVar8->status == 0)) {
          pnVar8->status = nVar18;
        }
        bVar31 = false;
        goto LAB_0016ed20;
      }
      pnVar17 = (ngx_uint_t *)ngx_list_push((ngx_list_t *)buf._72_8_);
      if (pnVar17 == (ngx_uint_t *)0x0) {
        return -1;
      }
      pnVar21 = f->split_parts;
      if ((pnVar21 == (ngx_array_t *)0x0) || (nVar18 = pnVar21->nelts, nVar18 == 0)) {
        nVar18 = (long)r->header_name_end - (long)r->header_name_start;
        pnVar17[1] = nVar18;
        nVar23 = (long)r->header_end - (long)r->header_start;
        pnVar17[3] = nVar23;
        pvVar19 = ngx_pnalloc(r->pool,nVar23 + nVar18 * 2 + 2);
        pnVar17[2] = (ngx_uint_t)pvVar19;
        if (pvVar19 == (void *)0x0) {
          return -1;
        }
        sVar6 = pnVar17[1];
        pnVar17[4] = (long)pvVar19 + sVar6 + 1;
        pnVar17[5] = (long)pvVar19 + pnVar17[3] + sVar6 + 2;
        memcpy(pvVar19,r->header_name_start,sVar6);
        *(undefined1 *)(pnVar17[2] + pnVar17[1]) = 0;
        memcpy((void *)pnVar17[4],r->header_start,pnVar17[3]);
        *(undefined1 *)(pnVar17[4] + pnVar17[3]) = 0;
      }
      else {
        sVar26 = (long)b->pos - (long)__src;
        plVar28 = (long *)((long)pnVar21->elts + 8);
        plVar22 = plVar28;
        while (bVar31 = nVar18 != 0, nVar18 = nVar18 - 1, bVar31) {
          sVar26 = (sVar26 + *plVar22) - plVar22[-1];
          plVar22 = plVar22 + 2;
        }
        puVar25 = (u_char *)ngx_pnalloc(r->pool,sVar26);
        if (puVar25 == (u_char *)0x0) {
          return -1;
        }
        local_d8 = (undefined1  [8])puVar25;
        for (uVar29 = 0; uVar29 < f->split_parts->nelts; uVar29 = uVar29 + 1) {
          memcpy(puVar25,(void *)plVar28[-1],*plVar28 - plVar28[-1]);
          puVar25 = puVar25 + (*plVar28 - plVar28[-1]);
          plVar28 = plVar28 + 2;
        }
        memcpy(puVar25,__src,(long)b->pos - (long)__src);
        buf.pos = puVar25 + ((long)b->pos - (long)__src);
        f->split_parts->nelts = 0;
        nVar12 = ngx_http_parse_header_line(r,(ngx_buf_t *)local_d8,1);
        if (nVar12 != 0) {
          pnVar5 = r->connection->log;
          if (pnVar5->log_level < 2) {
            return -1;
          }
          ngx_log_error_core(2,pnVar5,0,"invalid header after joining FastCGI records");
          return -1;
        }
        puVar25 = r->header_name_start;
        puVar16 = r->header_name_end;
        pnVar17[1] = (long)puVar16 - (long)puVar25;
        pnVar17[2] = (ngx_uint_t)puVar25;
        *puVar16 = '\0';
        puVar25 = r->header_start;
        puVar16 = r->header_end;
        pnVar17[3] = (long)puVar16 - (long)puVar25;
        pnVar17[4] = (ngx_uint_t)puVar25;
        *puVar16 = '\0';
        pvVar19 = ngx_pnalloc(r->pool,pnVar17[1]);
        pnVar17[5] = (ngx_uint_t)pvVar19;
        if (pvVar19 == (void *)0x0) {
          return -1;
        }
      }
      *pnVar17 = r->header_hash;
      sVar6 = pnVar17[1];
      if (sVar6 == r->lowcase_index) {
        memcpy((u_char *)pnVar17[5],r->lowcase_header,sVar6);
      }
      else {
        ngx_strlow((u_char *)pnVar17[5],(u_char *)pnVar17[2],sVar6);
      }
      pvVar19 = ngx_hash_find(hash,*pnVar17,(u_char *)pnVar17[5],pnVar17[1]);
      if ((pvVar19 != (void *)0x0) &&
         (lVar20 = (**(code **)((long)pvVar19 + 0x10))
                             (r,pnVar17,*(undefined8 *)((long)pvVar19 + 0x18)), lVar20 != 0)) {
        return -1;
      }
      pnVar5 = r->connection->log;
      if ((pnVar5->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar5,0,"http fastcgi header: \"%V: %V\"",pnVar17 + 1,pnVar17 + 3);
      }
      puVar25 = (pnVar2->buffer).pos;
      puVar16 = (pnVar2->buffer).last;
    } while (puVar25 < puVar16);
    bVar31 = true;
LAB_0016ec84:
    bVar9 = false;
LAB_0016ed20:
    if (local_48 != (u_char *)0x0) {
      (pnVar2->buffer).last = local_48;
    }
    psVar1 = &f->length;
    *psVar1 = (size_t)(puVar15 + (*psVar1 - (long)b->pos));
    if (*psVar1 == 0) {
      f->state = ngx_http_fastcgi_st_padding;
    }
    if (bVar9) {
      return 0;
    }
    if (!bVar31) {
      pnVar5 = r->connection->log;
      if ((pnVar5->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar5,0,"upstream split a header line in FastCGI records");
      }
      pnVar21 = f->split_parts;
      if (pnVar21 == (ngx_array_t *)0x0) {
        pnVar21 = ngx_array_create(r->pool,1,0x10);
        f->split_parts = pnVar21;
        if (pnVar21 == (ngx_array_t *)0x0) {
          return -1;
        }
      }
      puVar30 = (undefined8 *)ngx_array_push(pnVar21);
      if (puVar30 == (undefined8 *)0x0) {
        return -1;
      }
      *puVar30 = __src;
      puVar30[1] = puVar13;
      if ((pnVar2->buffer).last <= (pnVar2->buffer).pos) {
        return -2;
      }
    }
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_fastcgi_process_header(ngx_http_request_t *r)
{
    u_char                         *p, *msg, *start, *last,
                                   *part_start, *part_end;
    size_t                          size;
    ngx_str_t                      *status_line, *pattern;
    ngx_int_t                       rc, status;
    ngx_buf_t                       buf;
    ngx_uint_t                      i;
    ngx_table_elt_t                *h;
    ngx_http_upstream_t            *u;
    ngx_http_fastcgi_ctx_t         *f;
    ngx_http_upstream_header_t     *hh;
    ngx_http_fastcgi_loc_conf_t    *flcf;
    ngx_http_fastcgi_split_part_t  *part;
    ngx_http_upstream_main_conf_t  *umcf;

    f = ngx_http_get_module_ctx(r, ngx_http_fastcgi_module);

    umcf = ngx_http_get_module_main_conf(r, ngx_http_upstream_module);

    u = r->upstream;

    for ( ;; ) {

        if (f->state < ngx_http_fastcgi_st_data) {

            f->pos = u->buffer.pos;
            f->last = u->buffer.last;

            rc = ngx_http_fastcgi_process_record(r, f);

            u->buffer.pos = f->pos;
            u->buffer.last = f->last;

            if (rc == NGX_AGAIN) {
                return NGX_AGAIN;
            }

            if (rc == NGX_ERROR) {
                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }

            if (f->type != NGX_HTTP_FASTCGI_STDOUT
                && f->type != NGX_HTTP_FASTCGI_STDERR)
            {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unexpected FastCGI record: %ui",
                              f->type);

                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }

            if (f->type == NGX_HTTP_FASTCGI_STDOUT && f->length == 0) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream prematurely closed FastCGI stdout");

                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }
        }

        if (f->state == ngx_http_fastcgi_st_padding) {

            if (u->buffer.pos + f->padding < u->buffer.last) {
                f->state = ngx_http_fastcgi_st_version;
                u->buffer.pos += f->padding;

                continue;
            }

            if (u->buffer.pos + f->padding == u->buffer.last) {
                f->state = ngx_http_fastcgi_st_version;
                u->buffer.pos = u->buffer.last;

                return NGX_AGAIN;
            }

            f->padding -= u->buffer.last - u->buffer.pos;
            u->buffer.pos = u->buffer.last;

            return NGX_AGAIN;
        }


        /* f->state == ngx_http_fastcgi_st_data */

        if (f->type == NGX_HTTP_FASTCGI_STDERR) {

            if (f->length) {
                msg = u->buffer.pos;

                if (u->buffer.pos + f->length <= u->buffer.last) {
                    u->buffer.pos += f->length;
                    f->length = 0;
                    f->state = ngx_http_fastcgi_st_padding;

                } else {
                    f->length -= u->buffer.last - u->buffer.pos;
                    u->buffer.pos = u->buffer.last;
                }

                for (p = u->buffer.pos - 1; msg < p; p--) {
                    if (*p != LF && *p != CR && *p != '.' && *p != ' ') {
                        break;
                    }
                }

                p++;

                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "FastCGI sent in stderr: \"%*s\"", p - msg, msg);

                flcf = ngx_http_get_module_loc_conf(r, ngx_http_fastcgi_module);

                if (flcf->catch_stderr) {
                    pattern = flcf->catch_stderr->elts;

                    for (i = 0; i < flcf->catch_stderr->nelts; i++) {
                        if (ngx_strnstr(msg, (char *) pattern[i].data,
                                        p - msg)
                            != NULL)
                        {
                            return NGX_HTTP_UPSTREAM_INVALID_HEADER;
                        }
                    }
                }

                if (u->buffer.pos == u->buffer.last) {

                    if (!f->fastcgi_stdout) {

                        /*
                         * the special handling the large number
                         * of the PHP warnings to not allocate memory
                         */

#if (NGX_HTTP_CACHE)
                        if (r->cache) {
                            u->buffer.pos = u->buffer.start
                                                     + r->cache->header_start;
                        } else {
                            u->buffer.pos = u->buffer.start;
                        }
#else
                        u->buffer.pos = u->buffer.start;
#endif
                        u->buffer.last = u->buffer.pos;
                        f->large_stderr = 1;
                    }

                    return NGX_AGAIN;
                }

            } else {
                f->state = ngx_http_fastcgi_st_padding;
            }

            continue;
        }


        /* f->type == NGX_HTTP_FASTCGI_STDOUT */

#if (NGX_HTTP_CACHE)

        if (f->large_stderr && r->cache) {
            ssize_t                     len;
            ngx_http_fastcgi_header_t  *fh;

            start = u->buffer.start + r->cache->header_start;

            len = u->buffer.pos - start - 2 * sizeof(ngx_http_fastcgi_header_t);

            /*
             * A tail of large stderr output before HTTP header is placed
             * in a cache file without a FastCGI record header.
             * To workaround it we put a dummy FastCGI record header at the
             * start of the stderr output or update r->cache_header_start,
             * if there is no enough place for the record header.
             */

            if (len >= 0) {
                fh = (ngx_http_fastcgi_header_t *) start;
                fh->version = 1;
                fh->type = NGX_HTTP_FASTCGI_STDERR;
                fh->request_id_hi = 0;
                fh->request_id_lo = 1;
                fh->content_length_hi = (u_char) ((len >> 8) & 0xff);
                fh->content_length_lo = (u_char) (len & 0xff);
                fh->padding_length = 0;
                fh->reserved = 0;

            } else {
                r->cache->header_start += u->buffer.pos - start
                                          - sizeof(ngx_http_fastcgi_header_t);
            }

            f->large_stderr = 0;
        }

#endif

        f->fastcgi_stdout = 1;

        start = u->buffer.pos;

        if (u->buffer.pos + f->length < u->buffer.last) {

            /*
             * set u->buffer.last to the end of the FastCGI record data
             * for ngx_http_parse_header_line()
             */

            last = u->buffer.last;
            u->buffer.last = u->buffer.pos + f->length;

        } else {
            last = NULL;
        }

        for ( ;; ) {

            part_start = u->buffer.pos;
            part_end = u->buffer.last;

            rc = ngx_http_parse_header_line(r, &u->buffer, 1);

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http fastcgi parser: %i", rc);

            if (rc == NGX_AGAIN) {
                break;
            }

            if (rc == NGX_OK) {

                /* a header line has been parsed successfully */

                h = ngx_list_push(&u->headers_in.headers);
                if (h == NULL) {
                    return NGX_ERROR;
                }

                if (f->split_parts && f->split_parts->nelts) {

                    part = f->split_parts->elts;
                    size = u->buffer.pos - part_start;

                    for (i = 0; i < f->split_parts->nelts; i++) {
                        size += part[i].end - part[i].start;
                    }

                    p = ngx_pnalloc(r->pool, size);
                    if (p == NULL) {
                        return NGX_ERROR;
                    }

                    buf.pos = p;

                    for (i = 0; i < f->split_parts->nelts; i++) {
                        p = ngx_cpymem(p, part[i].start,
                                       part[i].end - part[i].start);
                    }

                    p = ngx_cpymem(p, part_start, u->buffer.pos - part_start);

                    buf.last = p;

                    f->split_parts->nelts = 0;

                    rc = ngx_http_parse_header_line(r, &buf, 1);

                    if (rc != NGX_OK) {
                        ngx_log_error(NGX_LOG_ALERT, r->connection->log, 0,
                                      "invalid header after joining "
                                      "FastCGI records");
                        return NGX_ERROR;
                    }

                    h->key.len = r->header_name_end - r->header_name_start;
                    h->key.data = r->header_name_start;
                    h->key.data[h->key.len] = '\0';

                    h->value.len = r->header_end - r->header_start;
                    h->value.data = r->header_start;
                    h->value.data[h->value.len] = '\0';

                    h->lowcase_key = ngx_pnalloc(r->pool, h->key.len);
                    if (h->lowcase_key == NULL) {
                        return NGX_ERROR;
                    }

                } else {

                    h->key.len = r->header_name_end - r->header_name_start;
                    h->value.len = r->header_end - r->header_start;

                    h->key.data = ngx_pnalloc(r->pool,
                                              h->key.len + 1 + h->value.len + 1
                                              + h->key.len);
                    if (h->key.data == NULL) {
                        return NGX_ERROR;
                    }

                    h->value.data = h->key.data + h->key.len + 1;
                    h->lowcase_key = h->key.data + h->key.len + 1
                                     + h->value.len + 1;

                    ngx_memcpy(h->key.data, r->header_name_start, h->key.len);
                    h->key.data[h->key.len] = '\0';
                    ngx_memcpy(h->value.data, r->header_start, h->value.len);
                    h->value.data[h->value.len] = '\0';
                }

                h->hash = r->header_hash;

                if (h->key.len == r->lowcase_index) {
                    ngx_memcpy(h->lowcase_key, r->lowcase_header, h->key.len);

                } else {
                    ngx_strlow(h->lowcase_key, h->key.data, h->key.len);
                }

                hh = ngx_hash_find(&umcf->headers_in_hash, h->hash,
                                   h->lowcase_key, h->key.len);

                if (hh && hh->handler(r, h, hh->offset) != NGX_OK) {
                    return NGX_ERROR;
                }

                ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                               "http fastcgi header: \"%V: %V\"",
                               &h->key, &h->value);

                if (u->buffer.pos < u->buffer.last) {
                    continue;
                }

                /* the end of the FastCGI record */

                break;
            }

            if (rc == NGX_HTTP_PARSE_HEADER_DONE) {

                /* a whole header has been parsed successfully */

                ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                               "http fastcgi header done");

                if (u->headers_in.status) {
                    status_line = &u->headers_in.status->value;

                    status = ngx_atoi(status_line->data, 3);

                    if (status == NGX_ERROR) {
                        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                                      "upstream sent invalid status \"%V\"",
                                      status_line);
                        return NGX_HTTP_UPSTREAM_INVALID_HEADER;
                    }

                    u->headers_in.status_n = status;
                    u->headers_in.status_line = *status_line;

                } else if (u->headers_in.location) {
                    u->headers_in.status_n = 302;
                    ngx_str_set(&u->headers_in.status_line,
                                "302 Moved Temporarily");

                } else {
                    u->headers_in.status_n = 200;
                    ngx_str_set(&u->headers_in.status_line, "200 OK");
                }

                if (u->state && u->state->status == 0) {
                    u->state->status = u->headers_in.status_n;
                }

                break;
            }

            /* there was error while a header line parsing */

            ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                          "upstream sent invalid header");

            return NGX_HTTP_UPSTREAM_INVALID_HEADER;
        }

        if (last) {
            u->buffer.last = last;
        }

        f->length -= u->buffer.pos - start;

        if (f->length == 0) {
            f->state = ngx_http_fastcgi_st_padding;
        }

        if (rc == NGX_HTTP_PARSE_HEADER_DONE) {
            return NGX_OK;
        }

        if (rc == NGX_OK) {
            continue;
        }

        /* rc == NGX_AGAIN */

        ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "upstream split a header line in FastCGI records");

        if (f->split_parts == NULL) {
            f->split_parts = ngx_array_create(r->pool, 1,
                                        sizeof(ngx_http_fastcgi_split_part_t));
            if (f->split_parts == NULL) {
                return NGX_ERROR;
            }
        }

        part = ngx_array_push(f->split_parts);
        if (part == NULL) {
            return NGX_ERROR;
        }

        part->start = part_start;
        part->end = part_end;

        if (u->buffer.pos < u->buffer.last) {
            continue;
        }

        return NGX_AGAIN;
    }
}